

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlitFboCase::~BlitFboCase(BlitFboCase *this)

{
  BlitFboCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlitFboCase_032bfdf8;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::~MovePtr(&this->m_vbo);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            (&this->m_program);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~MovePtr(&this->m_dstRbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~MovePtr(&this->m_srcRbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr(&this->m_dstFbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr(&this->m_srcFbo);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
  ::~vector(&this->m_iterations);
  gles31::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BlitFboCase::~BlitFboCase (void)
{
	deinit();
}